

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::GenerateNodeGraph(Discreet3DSImporter *this,aiScene *pcOut)

{
  char *__haystack;
  uint uVar1;
  Node *node;
  uint a;
  ai_uint32 aVar2;
  aiNode *paVar3;
  aiAnimation **ppaVar4;
  aiAnimation *this_00;
  aiNodeAnim **ppaVar5;
  ulong uVar6;
  char *pcVar7;
  Logger *this_01;
  aiNode **ppaVar8;
  uint *puVar9;
  aiNode *paVar10;
  Scene *pSVar11;
  aiMatrix4x4 *in_R8;
  uint uVar12;
  uint numChannel;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  paVar3 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar3);
  pcOut->mRootNode = paVar3;
  node = this->mRootNode;
  if ((node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_01 = DefaultLogger::get();
    Logger::warn(this_01,"No hierarchy information has been found in the file. ");
    pSVar11 = this->mScene;
    pcOut->mRootNode->mNumChildren =
         (int)((ulong)((long)(pSVar11->mLights).
                             super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar11->mLights).
                            super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(pSVar11->mCameras).
                             super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar11->mCameras).
                            super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) + pcOut->mNumMeshes;
    paVar3 = pcOut->mRootNode;
    ppaVar8 = (aiNode **)operator_new__((ulong)paVar3->mNumChildren << 3);
    paVar3->mChildren = ppaVar8;
    aiString::Set(&pcOut->mRootNode->mName,"<3DSDummyRoot>");
    for (uVar6 = 0; uVar12 = (uint)uVar6, uVar12 < pcOut->mNumMeshes; uVar6 = uVar6 + 1) {
      paVar3 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar3);
      pcOut->mRootNode->mChildren[uVar6] = paVar3;
      paVar3->mParent = pcOut->mRootNode;
      puVar9 = (uint *)operator_new__(4);
      paVar3->mMeshes = puVar9;
      *puVar9 = uVar12;
      paVar3->mNumMeshes = 1;
      aVar2 = snprintf((paVar3->mName).data,0x400,"3DSMesh_%u",uVar6 & 0xffffffff);
      (paVar3->mName).length = aVar2;
    }
    pSVar11 = this->mScene;
    for (uVar6 = 0;
        uVar6 < ((ulong)((long)(pSVar11->mCameras).
                               super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pSVar11->mCameras).
                              super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
        uVar6 = uVar6 + 1) {
      paVar10 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar10);
      pcOut->mRootNode->mChildren[uVar12 + (int)uVar6] = paVar10;
      paVar10->mParent = pcOut->mRootNode;
      pSVar11 = this->mScene;
      paVar3 = (aiNode *)
               (pSVar11->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      if (paVar10 != paVar3) {
        uVar1 = (paVar3->mName).length;
        (paVar10->mName).length = uVar1;
        memcpy((paVar10->mName).data,(paVar3->mName).data,(ulong)uVar1);
        (paVar10->mName).data[uVar1] = '\0';
      }
    }
    uVar12 = uVar12 + (int)uVar6;
    for (uVar6 = 0;
        uVar6 < ((ulong)((long)(pSVar11->mLights).
                               super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pSVar11->mLights).
                              super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
        uVar6 = uVar6 + 1) {
      paVar10 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar10);
      pcOut->mRootNode->mChildren[uVar12] = paVar10;
      paVar10->mParent = pcOut->mRootNode;
      pSVar11 = this->mScene;
      paVar3 = (aiNode *)
               (pSVar11->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      if (paVar10 != paVar3) {
        uVar1 = (paVar3->mName).length;
        (paVar10->mName).length = uVar1;
        memcpy((paVar10->mName).data,(paVar3->mName).data,(ulong)uVar1);
        (paVar10->mName).data[uVar1] = '\0';
      }
      uVar12 = uVar12 + 1;
    }
  }
  else {
    numChannel = 0;
    CountTracks(node,&numChannel);
    uVar6 = (ulong)numChannel;
    if (uVar6 != 0) {
      pcOut->mNumAnimations = 1;
      ppaVar4 = (aiAnimation **)operator_new__(8);
      pcOut->mAnimations = ppaVar4;
      this_00 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(this_00);
      *pcOut->mAnimations = this_00;
      aiString::Set((aiString *)this_00,"3DSMasterAnim");
      ppaVar5 = (aiNodeAnim **)operator_new__(uVar6 << 3);
      this_00->mChannels = ppaVar5;
    }
    AddNodeToGraph(this,pcOut,pcOut->mRootNode,this->mRootNode,in_R8);
  }
  for (uVar6 = 0; uVar6 < pcOut->mNumMeshes; uVar6 = uVar6 + 1) {
    pcOut->mMeshes[uVar6]->mColors[0] = (aiColor4D *)0x0;
    pcOut->mMeshes[uVar6]->mColors[1] = (aiColor4D *)0x0;
  }
  numChannel = 0x3f800000;
  fStack_6c = 0.0;
  fStack_68 = 0.0;
  fStack_64 = 0.0;
  fStack_60 = 0.0;
  local_5c = 0.0;
  local_58._0_4_ = 1.0;
  local_58._4_4_ = 0.0;
  uStack_50._0_4_ = 0.0;
  uStack_50._4_4_ = -1.0;
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0.0;
  local_38._0_4_ = 0.0;
  local_38._4_4_ = 1.0;
  aiMatrix4x4t<float>::operator*=
            ((aiMatrix4x4t<float> *)&numChannel,&pcOut->mRootNode->mTransformation);
  paVar3 = pcOut->mRootNode;
  (paVar3->mTransformation).a1 = (float)numChannel;
  (paVar3->mTransformation).a2 = fStack_6c;
  (paVar3->mTransformation).a3 = fStack_68;
  (paVar3->mTransformation).a4 = fStack_64;
  (paVar3->mTransformation).b1 = fStack_60;
  (paVar3->mTransformation).b2 = local_5c;
  (paVar3->mTransformation).b3 = (float)local_58;
  (paVar3->mTransformation).b4 = local_58._4_4_;
  (paVar3->mTransformation).c1 = (float)uStack_50;
  (paVar3->mTransformation).c2 = uStack_50._4_4_;
  (paVar3->mTransformation).c3 = (float)local_48;
  (paVar3->mTransformation).c4 = local_48._4_4_;
  (paVar3->mTransformation).d1 = (float)uStack_40;
  (paVar3->mTransformation).d2 = uStack_40._4_4_;
  (paVar3->mTransformation).d3 = (float)local_38;
  (paVar3->mTransformation).d4 = local_38._4_4_;
  paVar3 = pcOut->mRootNode;
  __haystack = (paVar3->mName).data;
  pcVar7 = strstr(__haystack,"UNNAMED");
  if ((pcVar7 != (char *)0x0) || ((*__haystack == '$' && ((paVar3->mName).data[1] == '$')))) {
    aiString::Set(&paVar3->mName,"<3DSRoot>");
  }
  return;
}

Assistant:

void Discreet3DSImporter::GenerateNodeGraph(aiScene* pcOut)
{
    pcOut->mRootNode = new aiNode();
    if (0 == mRootNode->mChildren.size())
    {
        //////////////////////////////////////////////////////////////////////////////
        // It seems the file is so messed up that it has not even a hierarchy.
        // generate a flat hiearachy which looks like this:
        //
        //                ROOT_NODE
        //                   |
        //   ----------------------------------------
        //   |       |       |            |         |
        // MESH_0  MESH_1  MESH_2  ...  MESH_N    CAMERA_0 ....
        //
        ASSIMP_LOG_WARN("No hierarchy information has been found in the file. ");

        pcOut->mRootNode->mNumChildren = pcOut->mNumMeshes +
            static_cast<unsigned int>(mScene->mCameras.size() + mScene->mLights.size());

        pcOut->mRootNode->mChildren = new aiNode* [ pcOut->mRootNode->mNumChildren ];
        pcOut->mRootNode->mName.Set("<3DSDummyRoot>");

        // Build dummy nodes for all meshes
        unsigned int a = 0;
        for (unsigned int i = 0; i < pcOut->mNumMeshes;++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
            pcNode->mNumMeshes = 1;

            // Build a name for the node
            pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "3DSMesh_%u",i);
        }

        // Build dummy nodes for all cameras
        for (unsigned int i = 0; i < (unsigned int )mScene->mCameras.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mCameras[i]->mName;
        }

        // Build dummy nodes for all lights
        for (unsigned int i = 0; i < (unsigned int )mScene->mLights.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mLights[i]->mName;
        }
    }
    else
    {
        // First of all: find out how many scaling, rotation and translation
        // animation tracks we'll have afterwards
        unsigned int numChannel = 0;
        CountTracks(mRootNode,numChannel);

        if (numChannel)
        {
            // Allocate a primary animation channel
            pcOut->mNumAnimations = 1;
            pcOut->mAnimations    = new aiAnimation*[1];
            aiAnimation* anim     = pcOut->mAnimations[0] = new aiAnimation();

            anim->mName.Set("3DSMasterAnim");

            // Allocate enough storage for all node animation channels,
            // but don't set the mNumChannels member - we'll use it to
            // index into the array
            anim->mChannels = new aiNodeAnim*[numChannel];
        }

        aiMatrix4x4 m;
        AddNodeToGraph(pcOut,  pcOut->mRootNode, mRootNode,m);
    }

    // We used the first and second vertex color set to store some temporary values so we need to cleanup here
    for (unsigned int a = 0; a < pcOut->mNumMeshes; ++a)
    {
        pcOut->mMeshes[a]->mColors[0] = NULL;
        pcOut->mMeshes[a]->mColors[1] = NULL;
    }

    pcOut->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pcOut->mRootNode->mTransformation;

    // If the root node is unnamed name it "<3DSRoot>"
    if (::strstr( pcOut->mRootNode->mName.data, "UNNAMED" ) ||
        (pcOut->mRootNode->mName.data[0] == '$' && pcOut->mRootNode->mName.data[1] == '$') )
    {
        pcOut->mRootNode->mName.Set("<3DSRoot>");
    }
}